

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

Am_Object put_objects_into_group
                    (Am_Value_List *selected_objs,Am_Value_List *selected_objs_places,
                    Am_Object *group,Am_Object *new_group)

{
  Am_Object_Data *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *value;
  Am_Object *pAVar7;
  Am_Object *in_R8;
  int value_00;
  int iVar8;
  int iVar9;
  Am_Object obj;
  Am_Object local_b8;
  int local_ac;
  Am_Value_List *local_a8;
  Am_Object_Data *local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object *local_80;
  Am_Object *local_78;
  Am_Object local_70;
  Am_Value_List *local_68;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Object local_40;
  Am_Object local_38;
  
  local_b8.data = (Am_Object_Data *)0x0;
  selected_objs->data = (Am_Value_List_Data *)0x0;
  local_a8 = selected_objs_places;
  local_a0 = (Am_Object_Data *)selected_objs;
  local_80 = in_R8;
  local_78 = new_group;
  local_68 = (Am_Value_List *)group;
  Am_Value_List::Start(selected_objs_places);
  iVar9 = -9999;
  local_ac = 9999;
  value_00 = 9999;
  iVar8 = -9999;
  while( true ) {
    bVar1 = Am_Value_List::Last(local_a8);
    iVar2 = local_ac;
    if (bVar1) break;
    pAVar6 = Am_Value_List::Get(local_a8);
    Am_Object::operator=(&local_b8,pAVar6);
    pAVar6 = Am_Object::Get(&local_b8,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&local_b8,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&local_b8,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&local_b8,0x67,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    if (iVar2 < local_ac) {
      local_ac = iVar2;
    }
    if (iVar3 < value_00) {
      value_00 = iVar3;
    }
    if (iVar9 < iVar4 + iVar2) {
      iVar9 = iVar4 + iVar2;
    }
    if (iVar8 < iVar5 + iVar3) {
      iVar8 = iVar5 + iVar3;
    }
    Am_Object::Am_Object(&local_40,&local_b8);
    Am_Object::Am_Object(&local_70,local_78);
    Am_Find_Part_Place(&local_38,&local_40);
    this = local_a0;
    Am_Object::operator=((Am_Object *)local_a0,&local_38);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_40);
    value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)this);
    Am_Value_List::Add(local_68,value,Am_TAIL,true);
    Am_Value_List::Next(local_a8);
  }
  pAVar7 = Am_Object::Set(local_80,100,local_ac,0);
  pAVar7 = Am_Object::Set(pAVar7,0x65,value_00,0x20000);
  pAVar7 = Am_Object::Set(pAVar7,0x66,iVar9 - iVar2,0x20000);
  Am_Object::Set(pAVar7,0x67,iVar8 - value_00,0x20000);
  Am_Value_List::Am_Value_List(&local_50,local_a8);
  adjust_objects_positions(&local_50,-iVar2,-value_00);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value_List::Am_Value_List(&local_60,local_a8);
  Am_Object::Am_Object(&local_88,local_78);
  Am_Object::Am_Object(&local_90,local_80);
  Am_Object::Am_Object(&local_98,&Am_No_Object);
  remove_and_add_objects(&local_60,&local_88,&local_90,&local_98);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&local_b8);
  return (Am_Object)local_a0;
}

Assistant:

Am_Object
put_objects_into_group(Am_Value_List selected_objs,
                       Am_Value_List &selected_objs_places, Am_Object group,
                       Am_Object new_group)
{
  int left, top, width, height;
  int left_offset = 9999;
  int top_offset = 9999;
  int right = -9999;
  int bottom = -9999;
  Am_Object obj, place;
  for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
    obj = selected_objs.Get();
    left = obj.Get(Am_LEFT);
    top = obj.Get(Am_TOP);
    width = obj.Get(Am_WIDTH);
    height = obj.Get(Am_HEIGHT);
    if (left < left_offset)
      left_offset = left;
    if (top < top_offset)
      top_offset = top;
    if (left + width > right)
      right = left + width;
    if (top + height > bottom)
      bottom = top + height;
    place = Am_Find_Part_Place(obj, group);
    selected_objs_places.Add(place);
  }
  new_group.Set(Am_LEFT, left_offset)
      .Set(Am_TOP, top_offset, Am_NO_ANIMATION)
      .Set(Am_WIDTH, right - left_offset, Am_NO_ANIMATION)
      .Set(Am_HEIGHT, bottom - top_offset, Am_NO_ANIMATION);
  adjust_objects_positions(selected_objs, -left_offset, -top_offset);
  remove_and_add_objects(selected_objs, group, new_group);
  return place;
}